

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

bool re2::StringPiece::_equal(StringPiece *x,StringPiece *y)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *p_limit;
  char *p2;
  char *p;
  int len;
  StringPiece *y_local;
  StringPiece *x_local;
  
  iVar1 = size(x);
  iVar2 = size(y);
  if (iVar1 == iVar2) {
    p2 = data(x);
    p_limit = data(y);
    if ((iVar1 < 1) || (p2[iVar1 + -1] == p_limit[iVar1 + -1])) {
      pcVar3 = p2 + iVar1;
      for (; p2 < pcVar3; p2 = p2 + 1) {
        if (*p2 != *p_limit) {
          return false;
        }
        p_limit = p_limit + 1;
      }
      x_local._7_1_ = true;
    }
    else {
      x_local._7_1_ = false;
    }
  }
  else {
    x_local._7_1_ = false;
  }
  return x_local._7_1_;
}

Assistant:

bool StringPiece::_equal(const StringPiece& x, const StringPiece& y) {
  int len = x.size();
  if (len != y.size()) {
    return false;
  }
  const char* p = x.data();
  const char* p2 = y.data();
  // Test last byte in case strings share large common prefix
  if ((len > 0) && (p[len-1] != p2[len-1])) return false;
  const char* p_limit = p + len;
  for (; p < p_limit; p++, p2++) {
    if (*p != *p2)
      return false;
  }
  return true;
}